

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_crypt.cc
# Opt level: O0

int rsa_padding_add_PKCS1_type_2(uint8_t *to,size_t to_len,uint8_t *from,size_t from_len)

{
  size_t len;
  size_t padding_len;
  size_t from_len_local;
  uint8_t *from_local;
  size_t to_len_local;
  uint8_t *to_local;
  
  if (to_len < 0xb) {
    ERR_put_error(4,0,0x7e,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_crypt.cc"
                  ,0xe0);
    to_local._4_4_ = 0;
  }
  else if (to_len - 0xb < from_len) {
    ERR_put_error(4,0,0x72,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_crypt.cc"
                  ,0xe5);
    to_local._4_4_ = 0;
  }
  else {
    *to = '\0';
    to[1] = '\x02';
    len = (to_len - 3) - from_len;
    rand_nonzero(to + 2,len);
    to[len + 2] = '\0';
    OPENSSL_memcpy(to + (to_len - from_len),from,from_len);
    to_local._4_4_ = 1;
  }
  return to_local._4_4_;
}

Assistant:

static int rsa_padding_add_PKCS1_type_2(uint8_t *to, size_t to_len,
                                        const uint8_t *from, size_t from_len) {
  // See RFC 8017, section 7.2.1.
  if (to_len < RSA_PKCS1_PADDING_SIZE) {
    OPENSSL_PUT_ERROR(RSA, RSA_R_KEY_SIZE_TOO_SMALL);
    return 0;
  }

  if (from_len > to_len - RSA_PKCS1_PADDING_SIZE) {
    OPENSSL_PUT_ERROR(RSA, RSA_R_DATA_TOO_LARGE_FOR_KEY_SIZE);
    return 0;
  }

  to[0] = 0;
  to[1] = 2;

  size_t padding_len = to_len - 3 - from_len;
  rand_nonzero(to + 2, padding_len);
  to[2 + padding_len] = 0;
  OPENSSL_memcpy(to + to_len - from_len, from, from_len);
  return 1;
}